

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_x86_avx.cpp
# Opt level: O2

void __thiscall ncnn::Pooling_x86_avx::create_pipeline(Pooling_x86_avx *this)

{
  Option *in_RSI;
  
  create_pipeline((Pooling_x86_avx *)
                  ((long)&this->_vptr_Pooling_x86_avx + (long)this->_vptr_Pooling_x86_avx[-6]),
                  in_RSI);
  return;
}

Assistant:

int Pooling_x86_avx::create_pipeline(const Option& /*opt*/)
{
    if (adaptive_pooling)
    {
        support_packing = false;

        support_bf16_storage = false;
        support_fp16_storage = false;
        support_int8_storage = false;
        support_tensor_storage = false;

        support_weight_fp16_storage = false;
    }
    return 0;
}